

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_decoder.cc
# Opt level: O0

StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> * __thiscall
draco::StlDecoder::DecodeFromBuffer(StlDecoder *this,DecoderBuffer *buffer)

{
  int iVar1;
  int iVar2;
  char *__s1;
  DecoderBuffer *in_RDX;
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *in_RDI;
  unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> mesh;
  uint16_t unused;
  float data [48];
  uint32_t i;
  int32_t norm_att_id;
  int32_t pos_att_id;
  TriangleSoupMeshBuilder builder;
  uint32_t face_count;
  Status *in_stack_fffffffffffffdf8;
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>
  *in_stack_fffffffffffffe00;
  DecoderBuffer *in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  allocator<char> *in_stack_fffffffffffffe30;
  allocator<char> *__s;
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *this_00;
  void *in_stack_fffffffffffffe58;
  float in_stack_fffffffffffffe60;
  float in_stack_fffffffffffffe64;
  TriangleSoupMeshBuilder *in_stack_fffffffffffffe68;
  FaceIndex in_stack_fffffffffffffe74;
  TriangleSoupMeshBuilder *in_stack_fffffffffffffe78;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_180;
  FaceIndex in_stack_fffffffffffffe84;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_170 [2];
  Scalar local_168;
  Scalar local_164;
  Scalar local_160;
  Scalar local_15c;
  Scalar local_158;
  Scalar local_154;
  Scalar local_150;
  Scalar local_14c;
  Scalar local_148;
  Scalar local_144;
  Scalar local_140;
  Scalar local_13c [38];
  uint local_a4;
  int local_a0;
  int local_9c;
  uint local_78;
  allocator<char> local_61;
  string local_60 [72];
  DecoderBuffer *local_18;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  this_00 = in_RDI;
  local_18 = in_RDX;
  __s1 = DecoderBuffer::data_head(in_RDX);
  iVar1 = strncmp(__s1,"solid ",6);
  if (iVar1 == 0) {
    __s = &local_61;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (char *)__s,in_stack_fffffffffffffe30);
    Status::Status(&in_stack_fffffffffffffe00->status_,
                   (Code)((ulong)in_stack_fffffffffffffdf8 >> 0x20),(string *)0x14878d);
    StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    Status::~Status((Status *)0x1487b0);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  else {
    DecoderBuffer::Advance(local_18,0x50);
    DecoderBuffer::Decode
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8
              );
    TriangleSoupMeshBuilder::TriangleSoupMeshBuilder
              ((TriangleSoupMeshBuilder *)in_stack_fffffffffffffe00);
    TriangleSoupMeshBuilder::Start
              ((TriangleSoupMeshBuilder *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),iVar2);
    iVar1 = TriangleSoupMeshBuilder::AddAttribute
                      ((TriangleSoupMeshBuilder *)in_stack_fffffffffffffe00,
                       (Type)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                       (int8_t)((ulong)in_stack_fffffffffffffdf8 >> 0x18),DT_INVALID);
    local_9c = iVar1;
    iVar2 = TriangleSoupMeshBuilder::AddAttribute
                      ((TriangleSoupMeshBuilder *)in_stack_fffffffffffffe00,
                       (Type)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                       (int8_t)((ulong)in_stack_fffffffffffffdf8 >> 0x18),DT_INVALID);
    local_a0 = iVar2;
    for (local_a4 = 0; local_a4 < local_78; local_a4 = local_a4 + 1) {
      DecoderBuffer::Decode
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 (size_t)in_stack_fffffffffffffdf8);
      DecoderBuffer::Decode
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 (size_t)in_stack_fffffffffffffdf8);
      IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(local_170,local_a4);
      VectorD<float,_3>::VectorD
                ((VectorD<float,_3> *)&stack0xfffffffffffffe84,&local_168,&local_164,&local_160);
      VectorD<float,_3>::data((VectorD<float,_3> *)0x14898f);
      TriangleSoupMeshBuilder::SetPerFaceAttributeValueForFace
                (in_stack_fffffffffffffe68,(int)in_stack_fffffffffffffe64,in_stack_fffffffffffffe74,
                 in_stack_fffffffffffffe58);
      IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(&local_180,local_a4);
      VectorD<float,_3>::VectorD
                ((VectorD<float,_3> *)&stack0xfffffffffffffe74,&local_15c,&local_158,&local_154);
      in_stack_fffffffffffffe08 =
           (DecoderBuffer *)VectorD<float,_3>::data((VectorD<float,_3> *)0x148a04);
      VectorD<float,_3>::VectorD
                ((VectorD<float,_3> *)&stack0xfffffffffffffe68,&local_150,&local_14c,&local_148);
      in_stack_fffffffffffffe00 =
           (StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
           VectorD<float,_3>::data((VectorD<float,_3> *)0x148a39);
      VectorD<float,_3>::VectorD
                ((VectorD<float,_3> *)&stack0xfffffffffffffe5c,&local_144,&local_140,local_13c);
      in_stack_fffffffffffffdf8 = (Status *)VectorD<float,_3>::data((VectorD<float,_3> *)0x148a6e);
      TriangleSoupMeshBuilder::SetAttributeValuesForFace
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe74.value_,
                 in_stack_fffffffffffffe84,in_stack_fffffffffffffe68,
                 (void *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 in_stack_fffffffffffffe58);
    }
    TriangleSoupMeshBuilder::Finalize((TriangleSoupMeshBuilder *)CONCAT44(iVar1,iVar2));
    StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
              (in_stack_fffffffffffffe00,
               (unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
               in_stack_fffffffffffffdf8);
    std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::~unique_ptr
              ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
               in_stack_fffffffffffffe00);
    TriangleSoupMeshBuilder::~TriangleSoupMeshBuilder
              ((TriangleSoupMeshBuilder *)in_stack_fffffffffffffe00);
  }
  return in_RDI;
}

Assistant:

StatusOr<std::unique_ptr<Mesh>> StlDecoder::DecodeFromBuffer(
    DecoderBuffer *buffer) {
  if (!strncmp(buffer->data_head(), "solid ", 6)) {
    return Status(Status::IO_ERROR,
                  "Currently only binary STL files are supported.");
  }
  buffer->Advance(80);
  uint32_t face_count;
  buffer->Decode(&face_count, 4);

  TriangleSoupMeshBuilder builder;
  builder.Start(face_count);

  const int32_t pos_att_id =
      builder.AddAttribute(GeometryAttribute::POSITION, 3, DT_FLOAT32);
  const int32_t norm_att_id =
      builder.AddAttribute(GeometryAttribute::NORMAL, 3, DT_FLOAT32);

  for (uint32_t i = 0; i < face_count; i++) {
    float data[48];
    buffer->Decode(data, 48);
    uint16_t unused;
    buffer->Decode(&unused, 2);

    builder.SetPerFaceAttributeValueForFace(
        norm_att_id, draco::FaceIndex(i),
        draco::Vector3f(data[0], data[1], data[2]).data());

    builder.SetAttributeValuesForFace(
        pos_att_id, draco::FaceIndex(i),
        draco::Vector3f(data[3], data[4], data[5]).data(),
        draco::Vector3f(data[6], data[7], data[8]).data(),
        draco::Vector3f(data[9], data[10], data[11]).data());
  }

  std::unique_ptr<Mesh> mesh = builder.Finalize();
  return mesh;
}